

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

void __thiscall Liby::http::ReplyParser::parse(ReplyParser *this,char *begin,char *end)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  key_type local_58;
  char *local_38;
  
  pcVar3 = begin;
  pcVar2 = begin;
  switch(this->progress_) {
  case 0:
    this->progress_ = 1;
    break;
  case 1:
    break;
  case 2:
    goto switchD_0011b50c_caseD_2;
  case 3:
    goto switchD_0011b50c_caseD_3;
  case 4:
    goto switchD_0011b50c_caseD_4;
  case 5:
    goto switchD_0011b50c_caseD_5;
  default:
    goto switchD_0011b50c_default;
  }
  local_58._M_dataplus._M_p._0_1_ = 0x20;
  pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
  if ((pcVar2 != (char *)0x0) && (bVar1 = ParseHttpVersion(this,begin,pcVar2), bVar1)) {
    pcVar2 = pcVar2 + 1;
    this->bytes_ = this->bytes_ + ((int)pcVar2 - (int)begin);
switchD_0011b50c_caseD_2:
    local_58._M_dataplus._M_p._0_1_ = 0x20;
    pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar2,end);
    if ((pcVar3 != (char *)0x0) && (bVar1 = ParseStatus(this,pcVar2,pcVar3), bVar1)) {
      pcVar3 = pcVar3 + 1;
      this->bytes_ = this->bytes_ + ((int)pcVar3 - (int)pcVar2);
switchD_0011b50c_caseD_3:
      local_58._M_dataplus._M_p._0_1_ = 10;
      pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar3,end);
      if (pcVar2 != (char *)0x0) {
        if (pcVar3 != (char *)0x0) {
          this->progress_ = 4;
          begin = pcVar2 + 1;
          this->bytes_ = this->bytes_ + ((int)begin - (int)pcVar3);
switchD_0011b50c_caseD_4:
          if (begin == end) {
switchD_0011b50c_caseD_5:
          }
          else {
            do {
              local_58._M_dataplus._M_p._0_1_ = 10;
              pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (begin,end,&local_58);
              if (pcVar3 == (char *)0x0) {
                return;
              }
              iVar8 = (int)begin;
              if ((begin == pcVar3) || (begin + 1 == pcVar3)) {
                this->progress_ = 5;
                begin = pcVar3 + 1;
                this->bytes_ = this->bytes_ + ((int)begin - iVar8);
                break;
              }
              pcVar2 = pcVar3;
              if (pcVar3[-1] == '\r') {
                pcVar2 = pcVar3 + -1;
              }
              bVar1 = ParseHeader(this,begin,pcVar2);
              if (!bVar1) {
                return;
              }
              begin = pcVar3 + 1;
              this->bytes_ = this->bytes_ + ((int)begin - iVar8);
            } while (begin != end);
          }
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Content-Length","");
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(this->super_Reply).headers_,&local_58);
          pcVar3 = (pmVar4->_M_dataplus)._M_p;
          piVar5 = __errno_location();
          iVar8 = *piVar5;
          *piVar5 = 0;
          lVar6 = strtol(pcVar3,&local_38,10);
          if (local_38 == pcVar3) {
            std::__throw_invalid_argument("stoi");
          }
          else {
            iVar7 = (int)lVar6;
            if ((iVar7 == lVar6) && (*piVar5 != 0x22)) {
              if (*piVar5 == 0) {
                *piVar5 = iVar8;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p);
              }
              if (iVar7 != 0) {
                if ((long)end - (long)begin < (long)iVar7) {
                  return;
                }
                this->progress_ = 6;
                this->bytes_ = this->bytes_ + iVar7;
                Buffer::append(&(this->super_Reply).content_,begin,(long)iVar7);
                return;
              }
              this->progress_ = 6;
              return;
            }
          }
          std::__throw_out_of_range("stoi");
        }
        __assert_fail("begin && end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                      ,0x1b8,
                      "bool Liby::http::ReplyParser::ParseStatusString(const char *, const char *)")
        ;
      }
    }
  }
switchD_0011b50c_default:
  return;
}

Assistant:

void ReplyParser::parse(const char *begin, const char *end) {
    bool flag;
    const char *finish = nullptr;
    switch (progress_) {
    default:
        break;
    case Good:
        break;
    case ParseStarting:
        progress_ = ParsingVersion;
    case ParsingVersion:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseHttpVersion(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatus:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseStatus(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatusString:
        finish = std::find(begin, end, '\n');
        if (finish == nullptr)
            return;
        flag = ParseStatusString(begin,
                                 *(finish - 1) == '\r' ? finish - 1 : finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingHeaders: {
        while (begin != end) {
            finish = std::find(begin, end, '\n');
            if (finish == nullptr)
                return;
            if (begin == finish || begin + 1 == finish) {
                progress_ = ParsingBody;
                bytes_ += ++finish - begin;
                begin = finish;
                break;
            }
            flag =
                ParseHeader(begin, *(finish - 1) == '\r' ? finish - 1 : finish);
            if (flag == false)
                return;
            bytes_ += ++finish - begin;
            begin = finish;
        }
    }
    case ParsingBody: {
        int len = std::stoi(headers_["Content-Length"]);
        if (len == 0) {
            progress_ = Good;
            return;
        } else if (end - begin < len) {
            return;
        } else if (end - begin >= len) {
            progress_ = Good;
            bytes_ += len;
            content_.append(begin, len);
            return;
        }
    }
    }
}